

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascDecrypt.cpp
# Opt level: O1

int CascDirectCopy(LPBYTE pbOutBuffer,PDWORD pcbOutBuffer,LPBYTE pbInBuffer,DWORD cbInBuffer)

{
  int iVar1;
  
  iVar1 = 0x69;
  if (cbInBuffer - 1 <= *pcbOutBuffer) {
    memcpy(pbOutBuffer,pbInBuffer,(ulong)cbInBuffer);
    *pcbOutBuffer = cbInBuffer;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CascDirectCopy(LPBYTE pbOutBuffer, PDWORD pcbOutBuffer, LPBYTE pbInBuffer, DWORD cbInBuffer)
{
    // Check the buffer size
    if((cbInBuffer - 1) > pcbOutBuffer[0])
        return ERROR_INSUFFICIENT_BUFFER;

    // Copy the data
    memcpy(pbOutBuffer, pbInBuffer, cbInBuffer);
    pcbOutBuffer[0] = cbInBuffer;
    return ERROR_SUCCESS;
}